

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

word zzSubW2(word *a,size_t n,word w)

{
  word wVar1;
  size_t i;
  size_t sVar2;
  
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    wVar1 = a[sVar2];
    a[sVar2] = wVar1 - w;
    w = (word)CARRY8(wVar1 - w,w);
  }
  return w;
}

Assistant:

word zzSubW2(word a[], size_t n, register word w)
{
	size_t i;
	ASSERT(wwIsValid(a, n));
#ifndef SAFE_FAST
	for (i = 0; i < n; ++i)
		a[i] -= w, w = wordLess01(~w, a[i]);
#else
	for (i = 0; w && i < n; ++i)
		a[i] -= w, w = a[i] > (word)~w;
#endif
	return w;
}